

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

CURLcode cr_lc_read(Curl_easy *data,Curl_creader *reader,char *buf,size_t blen,size_t *pnread,
                   _Bool *peos)

{
  _Bool _Var1;
  CURLcode CVar2;
  void *pvVar3;
  _Bool local_71;
  _Bool eos;
  size_t n;
  size_t start;
  size_t i;
  size_t nread;
  void *pvStack_48;
  CURLcode result;
  cr_lc_ctx *ctx;
  _Bool *peos_local;
  size_t *pnread_local;
  size_t blen_local;
  char *buf_local;
  Curl_creader *reader_local;
  Curl_easy *data_local;
  
  pvStack_48 = reader->ctx;
  if ((*(byte *)((long)pvStack_48 + 0x60) >> 1 & 1) != 0) {
    *pnread = 0;
    *peos = true;
    return CURLE_OK;
  }
  ctx = (cr_lc_ctx *)peos;
  peos_local = (_Bool *)pnread;
  pnread_local = (size_t *)blen;
  blen_local = (size_t)buf;
  buf_local = (char *)reader;
  reader_local = (Curl_creader *)data;
  _Var1 = Curl_bufq_is_empty((bufq *)((long)pvStack_48 + 0x20));
  if (_Var1) {
    if ((*(byte *)((long)pvStack_48 + 0x60) & 1) != 0) {
      *(byte *)((long)pvStack_48 + 0x60) = *(byte *)((long)pvStack_48 + 0x60) & 0xfd | 2;
      peos_local[0] = false;
      peos_local[1] = false;
      peos_local[2] = false;
      peos_local[3] = false;
      peos_local[4] = false;
      peos_local[5] = false;
      peos_local[6] = false;
      peos_local[7] = false;
      *(undefined1 *)&(ctx->super).crt = 1;
      return CURLE_OK;
    }
    nread._4_4_ = Curl_creader_read((Curl_easy *)reader_local,*(Curl_creader **)(buf_local + 8),
                                    (char *)blen_local,(size_t)pnread_local,&i,&local_71);
    if (nread._4_4_ != CURLE_OK) {
      return nread._4_4_;
    }
    *(byte *)((long)pvStack_48 + 0x60) = *(byte *)((long)pvStack_48 + 0x60) & 0xfe | local_71 & 1U;
    if ((i == 0) || (pvVar3 = memchr((void *)blen_local,10,i), pvVar3 == (void *)0x0)) {
      if ((*(byte *)((long)pvStack_48 + 0x60) & 1) != 0) {
        *(byte *)((long)pvStack_48 + 0x60) = *(byte *)((long)pvStack_48 + 0x60) & 0xfd | 2;
      }
      *(size_t *)peos_local = i;
      *(bool *)&(ctx->super).crt = (*(byte *)((long)pvStack_48 + 0x60) >> 1 & 1) != 0;
      goto LAB_0017fdd8;
    }
    n = 0;
    for (start = 0; start < i; start = start + 1) {
      if ((*(char *)(blen_local + start) == '\n') &&
         ((*(byte *)((long)pvStack_48 + 0x60) >> 2 & 1) == 0)) {
        *(byte *)((long)pvStack_48 + 0x60) = *(byte *)((long)pvStack_48 + 0x60) & 0xfb;
        nread._4_4_ = Curl_bufq_cwrite((bufq *)((long)pvStack_48 + 0x20),(char *)(blen_local + n),
                                       start - n,(size_t *)&stack0xffffffffffffff90);
        if (nread._4_4_ == CURLE_OK) {
          nread._4_4_ = Curl_bufq_cwrite((bufq *)((long)pvStack_48 + 0x20),"\r\n",2,
                                         (size_t *)&stack0xffffffffffffff90);
        }
        if (nread._4_4_ != CURLE_OK) {
          return nread._4_4_;
        }
        n = start + 1;
      }
      else {
        *(byte *)((long)pvStack_48 + 0x60) =
             *(byte *)((long)pvStack_48 + 0x60) & 0xfb |
             (*(char *)(blen_local + start) == '\r') << 2;
      }
    }
    if (n < start) {
      CVar2 = Curl_bufq_cwrite((bufq *)((long)pvStack_48 + 0x20),(char *)(blen_local + n),start - n,
                               (size_t *)&stack0xffffffffffffff90);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
      nread._4_4_ = CURLE_OK;
    }
  }
  *(undefined1 *)&(ctx->super).crt = 0;
  nread._4_4_ = Curl_bufq_cread((bufq *)((long)pvStack_48 + 0x20),(char *)blen_local,
                                (size_t)pnread_local,(size_t *)peos_local);
  if (((nread._4_4_ == CURLE_OK) && ((*(byte *)((long)pvStack_48 + 0x60) & 1) != 0)) &&
     (_Var1 = Curl_bufq_is_empty((bufq *)((long)pvStack_48 + 0x20)), _Var1)) {
    *(byte *)((long)pvStack_48 + 0x60) = *(byte *)((long)pvStack_48 + 0x60) & 0xfd | 2;
    *(undefined1 *)&(ctx->super).crt = 1;
  }
LAB_0017fdd8:
  if ((((reader_local != (Curl_creader *)0x0) &&
       ((*(ulong *)((long)&reader_local[0x51].ctx + 4) >> 0x1e & 1) != 0)) &&
      ((*(long *)&reader_local[0x98].phase == 0 ||
       (0 < *(int *)(*(long *)&reader_local[0x98].phase + 8))))) &&
     (0 < Curl_trc_feat_read.log_level)) {
    Curl_trc_read((Curl_easy *)reader_local,"cr_lc_read(len=%zu) -> %d, nread=%zu, eos=%d",
                  pnread_local,(ulong)nread._4_4_,*(undefined8 *)peos_local,
                  (ulong)(*(byte *)&(ctx->super).crt & 1));
  }
  return nread._4_4_;
}

Assistant:

static CURLcode cr_lc_read(struct Curl_easy *data,
                           struct Curl_creader *reader,
                           char *buf, size_t blen,
                           size_t *pnread, bool *peos)
{
  struct cr_lc_ctx *ctx = reader->ctx;
  CURLcode result;
  size_t nread, i, start, n;
  bool eos;

  if(ctx->eos) {
    *pnread = 0;
    *peos = TRUE;
    return CURLE_OK;
  }

  if(Curl_bufq_is_empty(&ctx->buf)) {
    if(ctx->read_eos) {
      ctx->eos = TRUE;
      *pnread = 0;
      *peos = TRUE;
      return CURLE_OK;
    }
    /* Still getting data form the next reader, ctx->buf is empty */
    result = Curl_creader_read(data, reader->next, buf, blen, &nread, &eos);
    if(result)
      return result;
    ctx->read_eos = eos;

    if(!nread || !memchr(buf, '\n', nread)) {
      /* nothing to convert, return this right away */
      if(ctx->read_eos)
        ctx->eos = TRUE;
      *pnread = nread;
      *peos = ctx->eos;
      goto out;
    }

    /* at least one \n might need conversion to '\r\n', place into ctx->buf */
    for(i = start = 0; i < nread; ++i) {
      /* if this byte is not an LF character, or if the preceding character is
         a CR (meaning this already is a CRLF pair), go to next */
      if((buf[i] != '\n') || ctx->prev_cr) {
        ctx->prev_cr = (buf[i] == '\r');
        continue;
      }
      ctx->prev_cr = FALSE;
      /* on a soft limit bufq, we do not need to check length */
      result = Curl_bufq_cwrite(&ctx->buf, buf + start, i - start, &n);
      if(!result)
        result = Curl_bufq_cwrite(&ctx->buf, STRCONST("\r\n"), &n);
      if(result)
        return result;
      start = i + 1;
    }

    if(start < i) { /* leftover */
      result = Curl_bufq_cwrite(&ctx->buf, buf + start, i - start, &n);
      if(result)
        return result;
    }
  }

  DEBUGASSERT(!Curl_bufq_is_empty(&ctx->buf));
  *peos = FALSE;
  result = Curl_bufq_cread(&ctx->buf, buf, blen, pnread);
  if(!result && ctx->read_eos && Curl_bufq_is_empty(&ctx->buf)) {
    /* no more data, read all, done. */
    ctx->eos = TRUE;
    *peos = TRUE;
  }

out:
  CURL_TRC_READ(data, "cr_lc_read(len=%zu) -> %d, nread=%zu, eos=%d",
                blen, result, *pnread, *peos);
  return result;
}